

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O3

void __thiscall
Diligent::ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>::Destroy
          (ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void> *this,
          IMemoryAllocator *Allocator)

{
  void *pvVar1;
  string msg;
  string local_38;
  
  pvVar1 = this->m_pVariables;
  if (pvVar1 != (void *)0x0) {
    if (this->m_pDbgAllocator != Allocator) {
      FormatString<char[74]>
                (&local_38,
                 (char (*) [74])
                 "The allocator is not the same as the one that was used to allocate memory");
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"Destroy",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                 ,0x357);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      pvVar1 = this->m_pVariables;
    }
    (*Allocator->_vptr_IMemoryAllocator[1])(Allocator,pvVar1);
    this->m_pVariables = (void *)0x0;
  }
  this->m_pDbgAllocator = (IMemoryAllocator *)0x0;
  return;
}

Assistant:

void Destroy(IMemoryAllocator& Allocator)
    {
        if (m_pVariables != nullptr)
        {
            VERIFY(m_pDbgAllocator == &Allocator, "The allocator is not the same as the one that was used to allocate memory");
            Allocator.Free(m_pVariables);
            m_pVariables = nullptr;
        }
#ifdef DILIGENT_DEBUG
        m_pDbgAllocator = nullptr;
#endif
    }